

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::clear_no_resize(dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *this)

{
  size_type sVar1;
  ulong uVar2;
  ulong uVar3;
  ValueType *pVVar4;
  float fVar5;
  
  if (this->num_elements != 0) {
    destroy_buckets(this,0,this->num_buckets);
    sVar1 = this->num_buckets;
    if (sVar1 != 0) {
      pVVar4 = &this->table->second;
      do {
        ((pair<const_char_*const,_ValueType> *)(pVVar4 + -1))->first = (this->key_info).empty_key;
        pVVar4->s_ = "hi";
        pVVar4 = pVVar4 + 2;
        sVar1 = sVar1 - 1;
      } while (sVar1 != 0);
    }
  }
  uVar3 = this->num_buckets;
  fVar5 = (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          enlarge_factor_ * (float)uVar3;
  uVar2 = (ulong)fVar5;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar5 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
  fVar5 = (float)uVar3 *
          (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          shrink_factor_;
  uVar3 = (ulong)fVar5;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar5 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  this->num_deleted = 0;
  this->num_elements = 0;
  return;
}

Assistant:

void clear_no_resize() {
    if (num_elements > 0) {
      assert(table);
      destroy_buckets(0, num_buckets);
      fill_range_with_empty(table, num_buckets);
    }
    // don't consider to shrink before another erase()
    settings.reset_thresholds(bucket_count());
    num_elements = 0;
    num_deleted = 0;
  }